

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

bool __thiscall
SQVM::CLOSURE_OP(SQVM *this,SQObjectPtr *target,SQFunctionProto *func,SQInteger boundtarget)

{
  SQUnsignedInteger *pSVar1;
  int iVar2;
  SQObjectType type;
  SQSharedState *ss;
  SQOuterVar *pSVar3;
  SQObjectPtr *pSVar4;
  SQWeakRef *pSVar5;
  SQClosure *x;
  SQChar *pSVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  
  ss = this->_sharedstate;
  pSVar5 = SQRefCounted::GetWeakRef((this->_roottable).super_SQObject._unVal.pRefCounted,OT_TABLE);
  x = SQClosure::Create(ss,func,pSVar5);
  lVar8 = func->_noutervalues;
  if (lVar8 != 0) {
    lVar7 = 0;
    if (lVar8 < 1) {
      lVar8 = lVar7;
    }
    lVar9 = 0x20;
    while (bVar10 = lVar8 != 0, lVar8 = lVar8 + -1, bVar10) {
      pSVar3 = func->_outervalues;
      iVar2 = *(int *)((long)pSVar3 + lVar9 + -0x20);
      if (iVar2 == 1) {
        SQObjectPtr::operator=
                  ((SQObjectPtr *)((long)&(x->_outervalues->super_SQObject)._type + lVar7),
                   ((this->ci->_closure).super_SQObject._unVal.pClosure)->_outervalues +
                   *(long *)((long)&pSVar3->_type + lVar9));
      }
      else if (iVar2 == 0) {
        FindOuter(this,(SQObjectPtr *)((long)&(x->_outervalues->super_SQObject)._type + lVar7),
                  (this->_stack)._vals + this->_stackbase + *(long *)((long)&pSVar3->_type + lVar9))
        ;
      }
      lVar9 = lVar9 + 0x28;
      lVar7 = lVar7 + 0x10;
    }
  }
  lVar8 = func->_ndefaultparams;
  if (lVar8 != 0) {
    lVar7 = 0;
    if (lVar8 < 1) {
      lVar8 = lVar7;
    }
    for (lVar9 = 0; lVar8 != lVar9; lVar9 = lVar9 + 1) {
      SQObjectPtr::operator=
                ((SQObjectPtr *)((long)&(x->_defaultparams->super_SQObject)._type + lVar7),
                 (this->_stack)._vals + this->_stackbase + func->_defaultparams[lVar9]);
      lVar7 = lVar7 + 0x10;
    }
  }
  if (boundtarget != 0xff) {
    pSVar4 = (this->_stack)._vals;
    type = pSVar4[this->_stackbase + boundtarget].super_SQObject._type;
    if ((((type == OT_ARRAY) || (type == OT_CLASS)) || (type == OT_INSTANCE)) || (type == OT_TABLE))
    {
      pSVar5 = SQRefCounted::GetWeakRef
                         (pSVar4[this->_stackbase + boundtarget].super_SQObject._unVal.pRefCounted,
                          type);
      x->_env = pSVar5;
      pSVar1 = &(pSVar5->super_SQRefCounted)._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    else {
      pSVar6 = IdType2Name(type);
      Raise_Error(this,"cannot bind a %s as environment object",pSVar6);
      (*(x->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])(x);
    }
    if (((type != OT_ARRAY) && (type != OT_CLASS)) && ((type != OT_INSTANCE && (type != OT_TABLE))))
    {
      return false;
    }
  }
  SQObjectPtr::operator=(target,x);
  return true;
}

Assistant:

bool SQVM::CLOSURE_OP(SQObjectPtr &target, SQFunctionProto *func,SQInteger boundtarget)
{
    SQInteger nouters;
    SQClosure *closure = SQClosure::Create(_ss(this), func,_table(_roottable)->GetWeakRef(OT_TABLE));
    if((nouters = func->_noutervalues)) {
        for(SQInteger i = 0; i<nouters; i++) {
            SQOuterVar &v = func->_outervalues[i];
            switch(v._type){
            case otLOCAL:
                FindOuter(closure->_outervalues[i], &STK(_integer(v._src)));
                break;
            case otOUTER:
                closure->_outervalues[i] = _closure(ci->_closure)->_outervalues[_integer(v._src)];
                break;
            }
        }
    }
    SQInteger ndefparams;
    if((ndefparams = func->_ndefaultparams)) {
        for(SQInteger i = 0; i < ndefparams; i++) {
            SQInteger spos = func->_defaultparams[i];
            closure->_defaultparams[i] = _stack._vals[_stackbase + spos];
        }
    }
	if (boundtarget != 0xFF) {
		SQObjectPtr &val = _stack._vals[_stackbase + boundtarget];
		SQObjectType t = sq_type(val);
		if (t == OT_TABLE || t == OT_CLASS || t == OT_INSTANCE || t == OT_ARRAY) {
			closure->_env = _refcounted(val)->GetWeakRef(t);
			__ObjAddRef(closure->_env);
		}
		else {
			Raise_Error(_SC("cannot bind a %s as environment object"), IdType2Name(t));
			closure->Release();
			return false;
		}
	}
    target = closure;
    return true;

}